

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1521.cpp
# Opt level: O2

int main(void)

{
  int x;
  undefined8 in_RAX;
  istream *this;
  ostream *poVar1;
  int i;
  int iVar2;
  int i_1;
  int iVar3;
  int iVar4;
  int k;
  int n;
  
  _k = in_RAX;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&n);
  std::istream::operator>>(this,&k);
  for (iVar2 = 0; iVar2 < n; iVar2 = iVar2 + 1) {
    update(iVar2,1);
  }
  iVar2 = k + -1;
  iVar4 = -1;
  for (iVar3 = 0; iVar3 < n; iVar3 = iVar3 + 1) {
    x = find_kth(1,iVar2 + 1);
    update(x,-1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x + 1);
    std::operator<<(poVar1," ");
    if (iVar3 < n + -1) {
      iVar2 = (k + iVar2 + -1) % (iVar4 + n);
    }
    iVar4 = iVar4 + -1;
  }
  return 0;
}

Assistant:

int main() {

    int n, k;
    std::cin >> n >> k;
    for (int i = 0; i < n; ++i) {
        update(i, 1);
//        for(int &item : t){
//            std::cout << item << " ";
//        }
//        std::cout << "\n";
    }
    int currPos = k - 1;
//    std::cout << "====================\n";

    for (int i = 0; i < n; ++i) {
        int pos = find_kth(1, currPos + 1);
        update(pos, -1);
//        for(int &item : t){
//            std::cout << item << " ";
//        }
//        std::cout << "\n";
        std::cout << pos + 1 << " ";
        if (i < n - 1)
            currPos = (currPos - 1 + k) % (n - i - 1);
    }
    return 0;
}